

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O0

void aom_img_flip(aom_image_t *img)

{
  aom_image_t *img_local;
  
  img->planes[0] = img->planes[0] + (int)((img->d_h - 1) * img->stride[0]);
  img->stride[0] = -img->stride[0];
  img->planes[1] =
       img->planes[1] +
       (int)(((img->d_h >> ((byte)img->y_chroma_shift & 0x1f)) - 1) * img->stride[1]);
  img->stride[1] = -img->stride[1];
  img->planes[2] =
       img->planes[2] +
       (int)(((img->d_h >> ((byte)img->y_chroma_shift & 0x1f)) - 1) * img->stride[2]);
  img->stride[2] = -img->stride[2];
  return;
}

Assistant:

void aom_img_flip(aom_image_t *img) {
  /* Note: In the calculation pointer adjustment calculation, we want the
   * rhs to be promoted to a signed type. Section 6.3.1.8 of the ISO C99
   * standard indicates that if the adjustment parameter is unsigned, the
   * stride parameter will be promoted to unsigned, causing errors when
   * the lhs is a larger type than the rhs.
   */
  img->planes[AOM_PLANE_Y] += (signed)(img->d_h - 1) * img->stride[AOM_PLANE_Y];
  img->stride[AOM_PLANE_Y] = -img->stride[AOM_PLANE_Y];

  img->planes[AOM_PLANE_U] += (signed)((img->d_h >> img->y_chroma_shift) - 1) *
                              img->stride[AOM_PLANE_U];
  img->stride[AOM_PLANE_U] = -img->stride[AOM_PLANE_U];

  img->planes[AOM_PLANE_V] += (signed)((img->d_h >> img->y_chroma_shift) - 1) *
                              img->stride[AOM_PLANE_V];
  img->stride[AOM_PLANE_V] = -img->stride[AOM_PLANE_V];
}